

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void __thiscall LogMessage::LogMessage(LogMessage *this,char *file,int line)

{
  ostream *poVar1;
  
  this->flushed_ = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->str_);
  poVar1 = std::operator<<((ostream *)&this->str_,file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  std::operator<<(poVar1,": ");
  return;
}

Assistant:

LogMessage(const char* file, int line)
      : flushed_(false) {
    stream() << file << ":" << line << ": ";
  }